

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::
ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::AlgebraicConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *this)

{
  CStringRef arg0;
  CStringRef arg0_00;
  char cVar1;
  TextReader<fmt::Locale> *in_RDI;
  int mask;
  int var_index;
  int flags;
  int i;
  double infinity;
  int num_bounds;
  AlgebraicConHandler bh;
  double ub;
  double lb;
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *in_stack_ffffffffffffff78;
  AlgebraicConHandler *in_stack_ffffffffffffff80;
  int iVar2;
  int in_stack_ffffffffffffff8c;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff90;
  BasicCStringRef<char> in_stack_ffffffffffffffa8;
  ComplInfo in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  BasicCStringRef<char> local_48;
  int local_3c;
  uint local_38;
  int local_34;
  double local_30;
  int local_24;
  AlgebraicConHandler local_20;
  double local_18;
  double local_10;
  
  TextReader<fmt::Locale>::ReadTillEndOfLine(in_RDI);
  local_10 = 0.0;
  local_18 = 0.0;
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::AlgebraicConHandler::
  AlgebraicConHandler(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_24 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::AlgebraicConHandler::
             num_items(&local_20);
  local_30 = INFINITY;
  local_34 = 0;
  do {
    if (local_24 <= local_34) {
      return;
    }
    cVar1 = ReaderBase::ReadChar((ReaderBase *)(in_RDI->super_ReaderBase).ptr_);
    switch(cVar1) {
    case '0':
      local_10 = TextReader<fmt::Locale>::ReadDouble(in_stack_ffffffffffffff90);
      local_18 = TextReader<fmt::Locale>::ReadDouble(in_stack_ffffffffffffff90);
      break;
    case '1':
      local_10 = -local_30;
      local_18 = TextReader<fmt::Locale>::ReadDouble(in_stack_ffffffffffffff90);
      break;
    case '2':
      local_10 = TextReader<fmt::Locale>::ReadDouble(in_stack_ffffffffffffff90);
      local_18 = local_30;
      break;
    case '3':
      local_10 = -local_30;
      local_18 = local_30;
      break;
    case '4':
      local_18 = TextReader<fmt::Locale>::ReadDouble(in_stack_ffffffffffffff90);
      local_10 = local_18;
      break;
    case '5':
      local_38 = TextReader<fmt::Locale>::ReadInt<int>(in_stack_ffffffffffffff90);
      local_3c = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x10cf1b);
      if ((local_3c == 0) || (*(int *)(in_RDI->super_ReaderBase).start_ < local_3c)) {
        in_stack_ffffffffffffff90 = (TextReader<fmt::Locale> *)(in_RDI->super_ReaderBase).ptr_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_48,"integer {} out of bounds");
        arg0.data_._4_4_ = in_stack_ffffffffffffffb4;
        arg0.data_._0_4_ = in_stack_ffffffffffffffb0.flags_;
        TextReader<fmt::Locale>::ReportError<int>
                  ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffa8.data_,arg0,(int *)in_RDI);
      }
      in_stack_ffffffffffffff8c = local_3c + -1;
      in_stack_ffffffffffffffb4 = 3;
      in_stack_ffffffffffffff80 = (AlgebraicConHandler *)(in_RDI->super_ReaderBase).end_;
      iVar2 = local_34;
      local_3c = in_stack_ffffffffffffff8c;
      ComplInfo::ComplInfo((ComplInfo *)&stack0xffffffffffffffb0,local_38 & 3);
      NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnComplementarity
                ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)
                 CONCAT44(in_stack_ffffffffffffff8c,iVar2),
                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                 (ComplInfo)(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      TextReader<fmt::Locale>::ReadTillEndOfLine(in_RDI);
      goto LAB_0010d023;
    default:
      in_stack_ffffffffffffff78 =
           (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *)
           (in_RDI->super_ReaderBase).ptr_;
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffffa8,"expected bound");
      arg0_00.data_._4_4_ = in_stack_ffffffffffffffb4;
      arg0_00.data_._0_4_ = in_stack_ffffffffffffffb0.flags_;
      TextReader<fmt::Locale>::ReportError<>
                ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffa8.data_,arg0_00);
    }
    TextReader<fmt::Locale>::ReadTillEndOfLine(in_RDI);
    NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::AlgebraicConHandler::SetBounds
              ((AlgebraicConHandler *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
               (double)in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78);
LAB_0010d023:
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}